

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Header6::Decode(Header6 *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  ostream *poVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte *pbVar3;
  KException *this_01;
  KDataStream *pKVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator<char> local_1e1;
  KString local_1e0;
  int local_1bc;
  char local_1b7;
  ushort local_1b6;
  KUINT16 i;
  stringstream local_1a8 [8];
  KStringStream ss;
  ostream local_198 [380];
  KUINT16 local_1c;
  undefined1 local_19;
  KUINT16 bufferSize;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Header6 *this_local;
  
  if (!ignoreHeader) {
    local_19 = ignoreHeader;
    pKStack_18 = stream;
    stream_local = (KDataStream *)this;
    KVar1 = KDataStream::GetBufferSize(stream);
    if (KVar1 < 0xc) {
      local_1c = KDataStream::GetBufferSize(pKStack_18);
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar2 = std::operator<<(local_198,"Received ");
      KVar1 = KDataStream::GetBufferSize(pKStack_18);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,KVar1);
      poVar2 = std::operator<<(poVar2," bytes. Expected minimum ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
      std::operator<<(poVar2," bytes.\nData: ");
      for (local_1b6 = 0; local_1b6 < local_1c; local_1b6 = local_1b6 + 1) {
        local_1b7 = (char)std::setfill<char>('0');
        poVar2 = std::operator<<(local_198,local_1b7);
        local_1bc = (int)std::setw(2);
        poVar2 = std::operator<<(poVar2,(_Setw)local_1bc);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
        this_00 = KDataStream::GetBuffer(pKStack_18);
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (this_00,(ulong)local_1b6);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*pbVar3);
        std::operator<<(poVar2," ");
      }
      std::operator<<(local_198,"\n");
      this_01 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"Decode",&local_1e1);
      std::__cxx11::stringstream::str();
      KException::KException<std::__cxx11::string>(this_01,&local_1e0,2,&local_208);
      __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
    }
    pKVar4 = KDataStream::operator>>(pKStack_18,&this->m_ui8ProtocolVersion);
    pKVar4 = KDataStream::operator>>(pKVar4,&this->m_ui8ExerciseID);
    pKVar4 = KDataStream::operator>>(pKVar4,&this->m_ui8PDUType);
    pKVar4 = KDataStream::operator>>(pKVar4,&this->m_ui8ProtocolFamily);
    pKVar4 = DATA_TYPE::operator>>(pKVar4,&(this->m_TimeStamp).super_DataTypeBase);
    pKVar4 = KDataStream::operator>>(pKVar4,&this->m_ui16PDULength);
    pKVar4 = KDataStream::operator>>(pKVar4,&this->m_ui8Padding1);
    KDataStream::operator>>(pKVar4,&this->m_ui8Padding2);
  }
  return;
}

Assistant:

void Header6::Decode(KDataStream &stream, bool ignoreHeader /*= false*/  ) noexcept(false)
{
    if( !ignoreHeader )
    {
        if( stream.GetBufferSize() < HEADER6_PDU_SIZE )
        {
            const KUINT16 bufferSize = stream.GetBufferSize();
            KStringStream ss;
            ss << "Received " << stream.GetBufferSize() << " bytes. Expected minimum " << HEADER6_PDU_SIZE << " bytes.\nData: ";
            for(KUINT16 i = 0; i < bufferSize; i++)
            {
                ss << std::setfill('0') << std::setw(std::numeric_limits<KUOCTET>::digits/4) << std::hex << static_cast<KUINT32>(stream.GetBuffer()[i]) << " ";
            }
            ss << "\n";
            throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER, ss.str() );
        }

        stream >> m_ui8ProtocolVersion
               >> m_ui8ExerciseID
               >> m_ui8PDUType
               >> m_ui8ProtocolFamily
               >> KDIS_STREAM m_TimeStamp
               >> m_ui16PDULength
               >> m_ui8Padding1
               >> m_ui8Padding2;
    }
}